

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void ws_cancel_close(nni_aio *aio,void *arg,int rv)

{
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  if (*(char *)((long)arg + 0x54) == '\x01') {
    *(undefined1 *)((long)arg + 0x54) = 0;
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return;
}

Assistant:

static void
ws_cancel_close(nni_aio *aio, void *arg, int rv)
{
	nni_ws *ws = arg;
	nni_mtx_lock(&ws->mtx);
	if (ws->wclose) {
		ws->wclose = false;
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&ws->mtx);
}